

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

int32_t lj_str_cmp(GCstr *a,GCstr *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = a->len;
  uVar2 = b->len;
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    uVar3 = uVar1;
  }
  iVar4 = uVar3 * -8;
  uVar7 = 0;
  while( true ) {
    iVar4 = iVar4 + 0x20;
    if (uVar3 <= uVar7) {
      return uVar1 - uVar2;
    }
    uVar5 = *(uint *)((long)&a[1].nextgc.gcptr32 + (ulong)uVar7);
    uVar6 = *(uint *)((long)&b[1].nextgc.gcptr32 + (ulong)uVar7);
    if (uVar5 != uVar6) break;
    uVar7 = uVar7 + 4;
  }
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  if (-4 < (int)(uVar7 - uVar3)) {
    uVar5 = uVar5 >> ((byte)iVar4 & 0x1f);
    uVar6 = uVar6 >> ((byte)iVar4 & 0x1f);
    if (uVar5 == uVar6) {
      return uVar1 - uVar2;
    }
  }
  return -(uint)(uVar5 < uVar6) | 1;
}

Assistant:

int32_t LJ_FASTCALL lj_str_cmp(GCstr *a, GCstr *b)
{
  MSize i, n = a->len > b->len ? b->len : a->len;
  for (i = 0; i < n; i += 4) {
    /* Note: innocuous access up to end of string + 3. */
    uint32_t va = *(const uint32_t *)(strdata(a)+i);
    uint32_t vb = *(const uint32_t *)(strdata(b)+i);
    if (va != vb) {
#if LJ_LE
      va = lj_bswap(va); vb = lj_bswap(vb);
#endif
      i -= n;
      if ((int32_t)i >= -3) {
	va >>= 32+(i<<3); vb >>= 32+(i<<3);
	if (va == vb) break;
      }
      return va < vb ? -1 : 1;
    }
  }
  return (int32_t)(a->len - b->len);
}